

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

obj * display_cinventory(obj *obj)

{
  int iVar1;
  char *pcVar2;
  obj *poVar3;
  object_pick *selected;
  char tmp [128];
  object_pick *local_90;
  char local_88 [128];
  
  local_90 = (object_pick *)0x0;
  pcVar2 = doname(obj);
  sprintf(local_88,"Contents of %s:",pcVar2);
  if (obj->cobj == (obj *)0x0) {
    invdisp_nothing(local_88,"(empty)");
    poVar3 = (obj *)0x0;
  }
  else {
    poVar3 = (obj *)0x0;
    iVar1 = query_objlist(local_88,obj->cobj,8,&local_90,0,allow_all);
    if (0 < iVar1) {
      poVar3 = local_90->obj;
      free(local_90);
    }
  }
  return poVar3;
}

Assistant:

struct obj *display_cinventory(struct obj *obj)
{
	struct obj *ret = NULL;
	char tmp[QBUFSZ];
	int n;
	struct object_pick *selected = 0;

	sprintf(tmp,"Contents of %s:", doname(obj));

	if (obj->cobj) {
	    n = query_objlist(tmp, obj->cobj, INVORDER_SORT, &selected,
			    PICK_NONE, allow_all);
	} else {
	    invdisp_nothing(tmp, "(empty)");
	    n = 0;
	}
	
	if (n > 0) {
	    ret = selected[0].obj;
	    free(selected);
	}
	
	return ret;
}